

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_save_indentation(Parser *this,size_t behind)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  State *pSVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar10;
  csubstr cVar11;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_88;
  size_t local_80;
  char msg [90];
  char *pcVar9;
  
  pSVar6 = this->m_state;
  pcVar10 = (pSVar6->line_contents).full.str;
  pcVar9 = (pSVar6->line_contents).rem.str;
  if (pcVar9 < pcVar10) {
    pcVar10 = 
    "check failed: (m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin())";
    pcVar9 = msg;
    for (lVar7 = 0x5a; lVar7 != 0; lVar7 = lVar7 + -1) {
      *pcVar9 = *pcVar10;
      pcVar10 = pcVar10 + 1;
      pcVar9 = pcVar9 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_80 = cVar11.len;
    pcStack_88 = cVar11.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x76c5) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x76c5) << 0x40,8);
    LVar3.name.str = pcStack_88;
    LVar3.name.len = local_80;
    (*p_Var1)(msg,0x5a,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pSVar6 = this->m_state;
    pcVar10 = (pSVar6->line_contents).full.str;
    pcVar9 = (pSVar6->line_contents).rem.str;
  }
  uVar8 = (long)pcVar9 - (long)pcVar10;
  pSVar6->indref = uVar8;
  if (uVar8 < behind) {
    builtin_strncpy(msg + 0x20,"->indref)",10);
    builtin_strncpy(msg + 0x10,"ehind <= m_state",0x10);
    builtin_strncpy(msg,"check failed: (b",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_a8 = cVar11.len;
    pcStack_b0 = cVar11.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x76c7) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x76c7) << 0x40,8);
    LVar4.name.str = pcStack_b0;
    LVar4.name.len = local_a8;
    (*p_Var1)(msg,0x2a,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar6 = this->m_state;
    uVar8 = pSVar6->indref;
  }
  pSVar6->indref = uVar8 - behind;
  return;
}

Assistant:

void Parser::_save_indentation(size_t behind)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin());
    m_state->indref = static_cast<size_t>(m_state->line_contents.rem.begin() - m_state->line_contents.full.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, behind <= m_state->indref);
    m_state->indref -= behind;
    _c4dbgpf("state[{}]: saving indentation: {}", m_state-m_stack.begin(), m_state->indref);
}